

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mediator_unittests.cc
# Opt level: O2

void __thiscall
cpp_mediator_request_mutations_preserved_Test::cpp_mediator_request_mutations_preserved_Test
          (cpp_mediator_request_mutations_preserved_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014e268;
  return;
}

Assistant:

TEST(cpp_mediator, request_mutations_preserved) {
  int number = 100;
  SendForWithArgs(d, &number);
  ASSERT_EQ(100, actual);
  ASSERT_EQ(101, *request_d.x);
  ASSERT_EQ(101, number);
  actual = m.send(request_d);
  ASSERT_EQ(101, actual);
  ASSERT_EQ(102, *request_d.x);
  ASSERT_EQ(102, number);
}